

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::CommandMigrate
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  anon_class_104_4_1aa776f0 local_b0;
  AsyncRequest local_48;
  string *local_28;
  string *aDstNetworkName_local;
  string *aDstAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_b0.this = this;
  local_28 = aDstNetworkName;
  aDstNetworkName_local = aDstAddr;
  aDstAddr_local = (string *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_b0.aHandler,aHandler);
  std::__cxx11::string::string((string *)&local_b0.aDstAddr,(string *)aDstNetworkName_local);
  std::__cxx11::string::string((string *)&local_b0.aDstNetworkName,(string *)local_28);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_48,&local_b0);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_b0);
  return;
}

Assistant:

void CommissionerSafe::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    PushAsyncRequest([=]() { mImpl->CommandMigrate(aHandler, aDstAddr, aDstNetworkName); });
}